

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O2

void If_Dec7ComposeLut4(int t,word (*f) [2],word *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  word *pwVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  
  *r = 0;
  r[1] = 0;
  uVar1 = 0;
  uVar3 = 0;
  for (uVar4 = 0; uVar4 != 0x10; uVar4 = uVar4 + 1) {
    if (((uint)t >> (uVar4 & 0x1f) & 1) != 0) {
      uVar5 = 0xffffffffffffffff;
      uVar2 = 0xffffffffffffffff;
      pwVar6 = *f + 1;
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        uVar9 = (*(word (*) [2])(pwVar6 + -1))[0];
        if ((uVar4 >> ((uint)lVar8 & 0x1f) & 1) == 0) {
          uVar9 = ~uVar9;
          uVar7 = ~*pwVar6;
        }
        else {
          uVar7 = *pwVar6;
        }
        uVar2 = uVar2 & uVar9;
        uVar5 = uVar5 & uVar7;
        pwVar6 = pwVar6 + 2;
      }
      uVar3 = uVar3 | uVar2;
      *r = uVar3;
      uVar1 = uVar1 | uVar5;
      r[1] = uVar1;
    }
  }
  return;
}

Assistant:

static void If_Dec7ComposeLut4( int t, word f[4][2], word r[2] )
{
    int m, v;
    word c[2];
    r[0] = r[1] = 0;
    for ( m = 0; m < 16; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c[0] = c[1] = ~(word)0;
        for ( v = 0; v < 4; v++ )
        {
            c[0] &= ((m >> v) & 1) ? f[v][0] : ~f[v][0];
            c[1] &= ((m >> v) & 1) ? f[v][1] : ~f[v][1];
        }
        r[0] |= c[0];
        r[1] |= c[1];
    }
}